

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_scaling.c
# Opt level: O3

cupdlp_retcode
cupdlp_pc_scaling(CUPDLPcsc *csc,cupdlp_float *cost,cupdlp_float *lower,cupdlp_float *upper,
                 cupdlp_float *rhs,CUPDLPscaling *scaling)

{
  size_t sVar1;
  double __y;
  int len;
  int len_00;
  int iVar2;
  cupdlp_float *col_scaling;
  cupdlp_float *row_scaling;
  size_t sVar3;
  long lVar4;
  int i;
  cupdlp_retcode cVar5;
  size_t sVar6;
  double dVar7;
  double dVar8;
  cupdlp_float __x;
  
  len = csc->nRows;
  len_00 = csc->nCols;
  sVar3 = (size_t)len_00;
  __y = scaling->PcAlpha;
  col_scaling = (cupdlp_float *)calloc(sVar3,8);
  cVar5 = 1;
  if ((col_scaling == (cupdlp_float *)0x0) ||
     (row_scaling = (cupdlp_float *)calloc((long)len,8), row_scaling == (cupdlp_float *)0x0)) {
    row_scaling = (cupdlp_float *)0x0;
  }
  else {
    if ((2.0 < __y) || (__y < 0.0)) {
      puts("alpha should be in [0, 2]");
      exit(1);
    }
    if (0 < len) {
      if (0 < len_00) {
        sVar6 = 0;
        do {
          iVar2 = csc->colMatBeg[sVar6];
          lVar4 = (long)iVar2;
          sVar1 = sVar6 + 1;
          if (iVar2 < csc->colMatBeg[sVar6 + 1]) {
            __x = col_scaling[sVar6];
            do {
              dVar8 = csc->colMatElem[lVar4];
              dVar7 = -dVar8;
              if (-dVar8 <= dVar8) {
                dVar7 = dVar8;
              }
              dVar8 = pow(dVar7,__y);
              __x = __x + dVar8;
              col_scaling[sVar6] = __x;
              lVar4 = lVar4 + 1;
            } while (lVar4 < csc->colMatBeg[sVar1]);
          }
          else {
            __x = col_scaling[sVar6];
          }
          dVar8 = pow(__x,1.0 / __y);
          if (dVar8 < 0.0) {
            dVar8 = sqrt(dVar8);
          }
          else {
            dVar8 = SQRT(dVar8);
          }
          col_scaling[sVar6] =
               (cupdlp_float)
               (~-(ulong)(dVar8 == 0.0) & (ulong)dVar8 | -(ulong)(dVar8 == 0.0) & 0x3ff0000000000000
               );
          sVar6 = sVar1;
        } while (sVar1 != sVar3);
      }
      if (0 < csc->colMatBeg[sVar3]) {
        lVar4 = 0;
        do {
          dVar8 = csc->colMatElem[lVar4];
          dVar7 = -dVar8;
          if (-dVar8 <= dVar8) {
            dVar7 = dVar8;
          }
          dVar8 = pow(dVar7,2.0 - __y);
          row_scaling[csc->colMatIdx[lVar4]] = dVar8 + row_scaling[csc->colMatIdx[lVar4]];
          lVar4 = lVar4 + 1;
        } while (lVar4 < csc->colMatBeg[sVar3]);
      }
      sVar3 = 0;
      do {
        dVar8 = pow(row_scaling[sVar3],1.0 / (2.0 - __y));
        if (dVar8 < 0.0) {
          dVar8 = sqrt(dVar8);
        }
        else {
          dVar8 = SQRT(dVar8);
        }
        row_scaling[sVar3] =
             (cupdlp_float)
             (~-(ulong)(dVar8 == 0.0) & (ulong)dVar8 | -(ulong)(dVar8 == 0.0) & 0x3ff0000000000000);
        sVar3 = sVar3 + 1;
      } while ((long)len != sVar3);
    }
    scale_problem(csc,cost,lower,upper,rhs,col_scaling,row_scaling);
    cupdlp_cdot(scaling->colScale,col_scaling,len_00);
    cupdlp_cdot(scaling->rowScale,row_scaling,len);
    cVar5 = 0;
  }
  free(col_scaling);
  free(row_scaling);
  return cVar5;
}

Assistant:

cupdlp_retcode cupdlp_pc_scaling(CUPDLPcsc *csc, cupdlp_float *cost,
                                 cupdlp_float *lower, cupdlp_float *upper,
                                 cupdlp_float *rhs, CUPDLPscaling *scaling)
// cupdlp_retcode cupdlp_pc_scaling(CUPDLPwork *work, cupdlp_float alpha)
{
  cupdlp_retcode retcode = RETCODE_OK;
  cupdlp_int nRows = csc->nRows;
  cupdlp_int nCols = csc->nCols;
  cupdlp_float alpha = scaling->PcAlpha;

  cupdlp_float *current_col_scaling = NULL;  // for variable
  cupdlp_float *current_row_scaling = NULL;  // for constraint
  CUPDLP_INIT_ZERO_DOUBLE(current_col_scaling, nCols);
  CUPDLP_INIT_ZERO_DOUBLE(current_row_scaling, nRows);

  if (alpha > 2.0 || alpha < 0.0) {
    cupdlp_printf("alpha should be in [0, 2]\n");
    exit(1);
  }

  if (nRows > 0) {
    for (int i = 0; i < nCols; i++) {
      for (int j = csc->colMatBeg[i]; j < csc->colMatBeg[i + 1]; j++) {
        current_col_scaling[i] += POWF(ABS(csc->colMatElem[j]), alpha);
      }
      current_col_scaling[i] = SQRTF(POWF(current_col_scaling[i], 1.0 / alpha));
      if (current_col_scaling[i] == 0.0) {
        current_col_scaling[i] = 1.0;
      }
    }

    for (int i = 0; i < csc->colMatBeg[nCols]; i++) {
      current_row_scaling[csc->colMatIdx[i]] +=
          POWF(ABS(csc->colMatElem[i]), 2.0 - alpha);
    }
    for (int i = 0; i < nRows; i++) {
      current_row_scaling[i] =
          SQRTF(POWF(current_row_scaling[i], 1.0 / (2.0 - alpha)));
      if (current_row_scaling[i] == 0.0) {
        current_row_scaling[i] = 1.0;
      }
    }
  }

  // apply scaling
  // scale_problem(work, current_col_scaling, current_row_scaling);
  scale_problem(csc, cost, lower, upper, rhs, current_col_scaling,
                current_row_scaling);

  // update scaling
  cupdlp_cdot(scaling->colScale, current_col_scaling, nCols);
  cupdlp_cdot(scaling->rowScale, current_row_scaling, nRows);

exit_cleanup:
  cupdlp_free(current_col_scaling);
  cupdlp_free(current_row_scaling);
  return retcode;
}